

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O0

void __thiscall soplex::SSVectorBase<double>::setValue(SSVectorBase<double> *this,int i,double x)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  int in_ESI;
  SSVectorBase<double> *in_RDI;
  value_type in_XMM0_Qa;
  SSVectorBase<double> *this_00;
  double dVar4;
  int n;
  undefined8 in_stack_ffffffffffffffc8;
  SSVectorBase<double> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = isSetup(in_RDI);
  if (bVar1) {
    iVar2 = pos(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    if (iVar2 < 0) {
      this_00 = (SSVectorBase<double> *)spxAbs<double>(in_XMM0_Qa);
      dVar4 = getEpsilon(this_00);
      if (dVar4 < (double)this_00) {
        IdxSet::add((IdxSet *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                    (int)((ulong)in_XMM0_Qa >> 0x20),
                    (int *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
      }
    }
    else if ((in_XMM0_Qa == 0.0) && (!NAN(in_XMM0_Qa))) {
      clearNum((SSVectorBase<double> *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
               (int)((ulong)in_RDI >> 0x20));
    }
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     (&(in_RDI->super_VectorBase<double>).val,(long)in_ESI);
  *pvVar3 = in_XMM0_Qa;
  return;
}

Assistant:

void setValue(int i, R x)
   {
      assert(i >= 0);
      assert(i < VectorBase<R>::dim());

      if(isSetup())
      {
         int n = pos(i);

         if(n < 0)
         {
            if(spxAbs(x) > this->getEpsilon())
               IdxSet::add(1, &i);
         }
         else if(x == R(0))
            clearNum(n);
      }

      VectorBase<R>::val[i] = x;

      assert(isConsistent());
   }